

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O3

void __thiscall duckdb::MergeSorter::MergeRadix(MergeSorter *this,idx_t *count,bool *left_smaller)

{
  SBScanState *pSVar1;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> target_block;
  idx_t iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  idx_t iVar4;
  size_type __n;
  SortLayout *pSVar5;
  pointer puVar6;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> _Var7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  data_ptr_t pdVar12;
  SortLayout *pSVar13;
  _Head_base<0UL,_duckdb::SBScanState_*,_false> this_00;
  type pSVar14;
  type this_01;
  reference pvVar15;
  pointer pRVar16;
  idx_t *entry_size;
  pointer pSVar17;
  ulong uVar18;
  size_type sVar19;
  size_t sVar20;
  ulong uVar21;
  data_ptr_t pdVar22;
  SortedBlock *pSVar23;
  data_ptr_t result_ptr;
  idx_t local_100;
  idx_t copied;
  idx_t *local_f0;
  SortLayout *local_e8;
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_e0;
  data_ptr_t l_ptr;
  __uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_> local_d0;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_c8;
  SortedBlock *local_c0;
  data_ptr_t r_ptr;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *local_b0;
  bool *local_a8;
  optional_ptr<duckdb::FileBuffer,_true> *local_a0;
  optional_ptr<duckdb::FileBuffer,_true> *local_98;
  type local_90;
  SortedBlock *local_88;
  idx_t local_80;
  idx_t local_78;
  BufferHandle result_handle;
  
  local_d0._M_t.
  super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
  super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
       (tuple<duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>)&this->left;
  local_a8 = left_smaller;
  pSVar14 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator*((unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>
                       *)local_d0._M_t.
                         super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                         .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
  local_b0 = &this->right;
  this_01 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator*(local_b0);
  iVar8 = pSVar14->block_idx;
  iVar9 = pSVar14->entry_idx;
  iVar10 = this_01->block_idx;
  iVar11 = this_01->entry_idx;
  local_88 = pSVar14->sb;
  pSVar1 = (SBScanState *)this_01->sb;
  pvVar15 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
            ::back(&this->result->radix_sorting_data);
  target_block._M_head_impl =
       (pvVar15->super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>)
       ._M_t.super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
       super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
  (*this->buffer_manager->_vptr_BufferManager[7])
            (&result_handle,this->buffer_manager,target_block._M_head_impl);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&result_handle.node);
  result_ptr = (result_handle.node.ptr)->buffer +
               this->sort_layout->entry_size * (target_block._M_head_impl)->count;
  copied = 0;
  if (*count != 0) {
    local_e8 = (SortLayout *)&pSVar14->entry_idx;
    local_f0 = &this_01->entry_idx;
    local_98 = &(pSVar14->radix_handle).node;
    local_a0 = &(this_01->radix_handle).node;
    local_e0._M_head_impl = pSVar1;
    local_c8._M_head_impl = (SortedBlock *)this;
    local_c0 = (SortedBlock *)count;
    local_90 = this_01;
    do {
      pSVar23 = local_88;
      this_00._M_head_impl = local_e0._M_head_impl;
      iVar4 = copied;
      if (pSVar14->block_idx <
          (ulong)((long)(local_88->radix_sorting_data).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_88->radix_sorting_data).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        iVar2 = local_e8->column_count;
        pvVar15 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](&local_88->radix_sorting_data,pSVar14->block_idx);
        pRVar16 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->(pvVar15);
        if (iVar2 == pRVar16->count) {
          pvVar15 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                    ::operator[](&pSVar23->radix_sorting_data,pSVar14->block_idx);
          pRVar16 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->(pvVar15);
          p_Var3 = (pRVar16->block).internal.
                   super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          (pRVar16->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pRVar16->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          pSVar14->block_idx = pSVar14->block_idx + 1;
          pSVar14->entry_idx = 0;
        }
      }
      uVar21 = this_01->block_idx;
      local_100 = iVar4;
      if (uVar21 < (ulong)((long)(this_00._M_head_impl)->sort_layout -
                           (long)(((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                                    *)&(this_00._M_head_impl)->buffer_manager)->
                                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        iVar4 = *local_f0;
        pvVar15 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                                *)this_00._M_head_impl,uVar21);
        pRVar16 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->(pvVar15);
        uVar21 = this_01->block_idx;
        if (iVar4 == pRVar16->count) {
          pvVar15 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                                  *)this_00._M_head_impl,uVar21);
          pRVar16 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->(pvVar15);
          p_Var3 = (pRVar16->block).internal.
                   super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          (pRVar16->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pRVar16->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          uVar21 = this_01->block_idx + 1;
          this_01->block_idx = uVar21;
          this_01->entry_idx = 0;
        }
      }
      __n = pSVar14->block_idx;
      sVar19 = (long)(pSVar23->radix_sorting_data).
                     super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pSVar23->radix_sorting_data).
                     super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      pSVar5 = (local_e0._M_head_impl)->sort_layout;
      puVar6 = (((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  *)&(local_e0._M_head_impl)->buffer_manager)->
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (__n == sVar19) {
        local_78 = 0;
      }
      else {
        pvVar15 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](&pSVar23->radix_sorting_data,__n);
        _Var7._M_head_impl =
             (pvVar15->
             super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
             .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
        pSVar17 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                  operator->((unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>
                              *)local_d0._M_t.
                                super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                                .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
        SBScanState::PinRadix(pSVar17,pSVar14->block_idx);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(local_98);
        l_ptr = ((pSVar14->radix_handle).node.ptr)->buffer +
                pSVar14->sort_layout->entry_size * pSVar14->entry_idx;
        local_78 = (_Var7._M_head_impl)->count;
      }
      pSVar23 = local_c0;
      pdVar22 = l_ptr;
      pSVar13 = local_e8;
      pdVar12 = result_ptr;
      if (uVar21 == (long)pSVar5 - (long)puVar6 >> 3) {
        uVar21 = (long)(local_c0->radix_sorting_data).
                       super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - local_100;
        uVar18 = (target_block._M_head_impl)->capacity - (target_block._M_head_impl)->count;
        if (uVar18 <= uVar21) {
          uVar21 = uVar18;
        }
        uVar18 = local_78 - local_e8->column_count;
        if (uVar21 < uVar18) {
          uVar18 = uVar21;
        }
        sVar20 = (*(SortLayout **)((long)local_c8._M_head_impl + 0x10))->entry_size * uVar18;
        switchD_00b041bd::default(result_ptr,l_ptr,sVar20);
        result_ptr = pdVar12 + sVar20;
        l_ptr = pdVar22 + sVar20;
        pSVar13->column_count = pSVar13->column_count + uVar18;
        (target_block._M_head_impl)->count = (target_block._M_head_impl)->count + uVar18;
        copied = local_100 + uVar18;
        this_01 = local_90;
      }
      else {
        pvVar15 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                                *)local_e0._M_head_impl,this_01->block_idx);
        pSVar23 = local_c0;
        _Var7._M_head_impl =
             (pvVar15->
             super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
             .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
        SBScanState::PinRadix(this_01,this_01->block_idx);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(local_a0);
        pdVar12 = result_ptr;
        pdVar22 = ((this_01->radix_handle).node.ptr)->buffer +
                  this_01->sort_layout->entry_size * this_01->entry_idx;
        local_80 = (_Var7._M_head_impl)->count;
        entry_size = &(*(SortLayout **)((long)local_c8._M_head_impl + 0x10))->entry_size;
        r_ptr = pdVar22;
        if (__n == sVar19) {
          uVar21 = (long)(pSVar23->radix_sorting_data).
                         super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start - local_100;
          uVar18 = (target_block._M_head_impl)->capacity - (target_block._M_head_impl)->count;
          if (uVar18 <= uVar21) {
            uVar21 = uVar18;
          }
          uVar18 = local_80 - this_01->entry_idx;
          if (uVar18 <= uVar21) {
            uVar21 = uVar18;
          }
          sVar20 = *entry_size * uVar21;
          switchD_00b041bd::default(result_ptr,pdVar22,sVar20);
          result_ptr = pdVar12 + sVar20;
          r_ptr = pdVar22 + sVar20;
          *local_f0 = *local_f0 + uVar21;
          (target_block._M_head_impl)->count = (target_block._M_head_impl)->count + uVar21;
          copied = local_100 + uVar21;
        }
        else {
          MergeRows((MergeSorter *)&copied,&l_ptr,&local_e8->column_count,&local_78,&r_ptr,local_f0,
                    &local_80,target_block._M_head_impl,&result_ptr,entry_size,local_a8,&copied,
                    (idx_t *)pSVar23);
        }
      }
    } while (copied < (pSVar23->radix_sorting_data).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  }
  pSVar17 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator->((unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>
                        *)local_d0._M_t.
                          super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                          .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
  pSVar17->block_idx = iVar8;
  pSVar17->entry_idx = iVar9;
  pSVar17 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator->(local_b0);
  pSVar17->block_idx = iVar10;
  pSVar17->entry_idx = iVar11;
  BufferHandle::~BufferHandle(&result_handle);
  return;
}

Assistant:

void MergeSorter::MergeRadix(const idx_t &count, const bool left_smaller[]) {
	auto &l = *left;
	auto &r = *right;
	// Save indices to restore afterwards
	idx_t l_block_idx_before = l.block_idx;
	idx_t l_entry_idx_before = l.entry_idx;
	idx_t r_block_idx_before = r.block_idx;
	idx_t r_entry_idx_before = r.entry_idx;

	auto &l_blocks = l.sb->radix_sorting_data;
	auto &r_blocks = r.sb->radix_sorting_data;
	RowDataBlock *l_block = nullptr;
	RowDataBlock *r_block = nullptr;

	data_ptr_t l_ptr;
	data_ptr_t r_ptr;

	RowDataBlock *result_block = result->radix_sorting_data.back().get();
	auto result_handle = buffer_manager.Pin(result_block->block);
	data_ptr_t result_ptr = result_handle.Ptr() + result_block->count * sort_layout.entry_size;

	idx_t copied = 0;
	while (copied < count) {
		// Move to the next block (if needed)
		if (l.block_idx < l_blocks.size() && l.entry_idx == l_blocks[l.block_idx]->count) {
			// Delete reference to previous block
			l_blocks[l.block_idx]->block = nullptr;
			// Advance block
			l.block_idx++;
			l.entry_idx = 0;
		}
		if (r.block_idx < r_blocks.size() && r.entry_idx == r_blocks[r.block_idx]->count) {
			// Delete reference to previous block
			r_blocks[r.block_idx]->block = nullptr;
			// Advance block
			r.block_idx++;
			r.entry_idx = 0;
		}
		const bool l_done = l.block_idx == l_blocks.size();
		const bool r_done = r.block_idx == r_blocks.size();
		// Pin the radix sortable blocks
		idx_t l_count;
		if (!l_done) {
			l_block = l_blocks[l.block_idx].get();
			left->PinRadix(l.block_idx);
			l_ptr = l.RadixPtr();
			l_count = l_block->count;
		} else {
			l_count = 0;
		}
		idx_t r_count;
		if (!r_done) {
			r_block = r_blocks[r.block_idx].get();
			r.PinRadix(r.block_idx);
			r_ptr = r.RadixPtr();
			r_count = r_block->count;
		} else {
			r_count = 0;
		}
		// Copy using computed merge
		if (!l_done && !r_done) {
			// Both sides have data - merge
			MergeRows(l_ptr, l.entry_idx, l_count, r_ptr, r.entry_idx, r_count, *result_block, result_ptr,
			          sort_layout.entry_size, left_smaller, copied, count);
		} else if (r_done) {
			// Right side is exhausted
			FlushRows(l_ptr, l.entry_idx, l_count, *result_block, result_ptr, sort_layout.entry_size, copied, count);
		} else {
			// Left side is exhausted
			FlushRows(r_ptr, r.entry_idx, r_count, *result_block, result_ptr, sort_layout.entry_size, copied, count);
		}
	}
	// Reset block indices
	left->SetIndices(l_block_idx_before, l_entry_idx_before);
	right->SetIndices(r_block_idx_before, r_entry_idx_before);
}